

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::ProcessRequest(cmServer *this,cmConnection *connection,string *input)

{
  bool bVar1;
  Value *pVVar2;
  pointer pDVar3;
  ulong uVar4;
  cmake *this_00;
  cmServerResponse local_4f0;
  cmServerResponse local_460;
  anon_class_8_1_c4a9256f local_3d0;
  ProgressCallbackType local_3c8;
  anon_class_8_1_c4a9256f local_3a8;
  MessageCallback local_3a0;
  allocator<char> local_379;
  string local_378;
  undefined1 local_358 [8];
  cmServerResponse response;
  string local_2a0;
  string local_280;
  undefined1 local_260 [8];
  cmServerRequest request;
  unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> local_1c8;
  undefined1 local_1c0 [8];
  Value debugValue;
  unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> debug;
  string local_188;
  undefined1 local_158 [8];
  Value value;
  Reader reader;
  string *input_local;
  cmConnection *connection_local;
  cmServer *this_local;
  
  Json::Reader::Reader((Reader *)&value.limit_);
  Json::Value::Value((Value *)local_158,nullValue);
  bVar1 = Json::Reader::parse((Reader *)&value.limit_,input,(Value *)local_158,true);
  if (bVar1) {
    std::unique_ptr<cmServer::DebugInfo,std::default_delete<cmServer::DebugInfo>>::
    unique_ptr<std::default_delete<cmServer::DebugInfo>,void>
              ((unique_ptr<cmServer::DebugInfo,std::default_delete<cmServer::DebugInfo>> *)
               &debugValue.limit_);
    pVVar2 = Json::Value::operator[]((Value *)local_158,"debug");
    Json::Value::Value((Value *)local_1c0,pVVar2);
    bVar1 = Json::Value::isNull((Value *)local_1c0);
    if (!bVar1) {
      std::make_unique<cmServer::DebugInfo>();
      std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::operator=
                ((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                 &debugValue.limit_,&local_1c8);
      std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::~unique_ptr
                (&local_1c8);
      pVVar2 = Json::Value::operator[]((Value *)local_1c0,"dumpToFile");
      Json::Value::asString_abi_cxx11_((string *)&request.m_Server,pVVar2);
      pDVar3 = std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::
               operator->((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                           *)&debugValue.limit_);
      std::__cxx11::string::operator=((string *)&pDVar3->OutputFile,(string *)&request.m_Server);
      std::__cxx11::string::~string((string *)&request.m_Server);
      pVVar2 = Json::Value::operator[]((Value *)local_1c0,"showStats");
      bVar1 = Json::Value::asBool(pVVar2);
      pDVar3 = std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::
               operator->((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                           *)&debugValue.limit_);
      pDVar3->PrintStatistics = bVar1;
    }
    pVVar2 = Json::Value::operator[]((Value *)local_158,&kTYPE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_280,pVVar2);
    pVVar2 = Json::Value::operator[]((Value *)local_158,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_2a0,pVVar2);
    Json::Value::Value((Value *)&response.m_Data.limit_,(Value *)local_158);
    cmServerRequest::cmServerRequest
              ((cmServerRequest *)local_260,this,connection,&local_280,&local_2a0,
               (Value *)&response.m_Data.limit_);
    Json::Value::~Value((Value *)&response.m_Data.limit_);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_3a8.request = (cmServerRequest *)local_260;
      std::function<void(std::__cxx11::string_const&,char_const*)>::
      function<cmServer::ProcessRequest(cmConnection*,std::__cxx11::string_const&)::__0,void>
                ((function<void(std::__cxx11::string_const&,char_const*)> *)&local_3a0,&local_3a8);
      cmSystemTools::SetMessageCallback(&local_3a0);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*)>
      ::~function(&local_3a0);
      if (this->Protocol == (cmServerProtocol *)0x0) {
        SetProtocolVersion(&local_4f0,this,(cmServerRequest *)local_260);
        pDVar3 = std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::
                 get((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                     &debugValue.limit_);
        WriteResponse(this,connection,&local_4f0,pDVar3);
        cmServerResponse::~cmServerResponse(&local_4f0);
      }
      else {
        this_00 = cmServerProtocol::CMakeInstance(this->Protocol);
        local_3d0.request = (cmServerRequest *)local_260;
        std::function<void(std::__cxx11::string_const&,float)>::
        function<cmServer::ProcessRequest(cmConnection*,std::__cxx11::string_const&)::__1,void>
                  ((function<void(std::__cxx11::string_const&,float)> *)&local_3c8,&local_3d0);
        cmake::SetProgressCallback(this_00,&local_3c8);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
        ::~function(&local_3c8);
        (*this->Protocol->_vptr_cmServerProtocol[4])(&local_460,this->Protocol,local_260);
        pDVar3 = std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::
                 get((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                     &debugValue.limit_);
        WriteResponse(this,connection,&local_460,pDVar3);
        cmServerResponse::~cmServerResponse(&local_460);
      }
      debug._M_t.
      super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>._M_t.
      super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>.
      super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl._0_4_ = 0;
    }
    else {
      cmServerResponse::cmServerResponse((cmServerResponse *)local_358,(cmServerRequest *)local_260)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"No type given in request.",&local_379);
      cmServerResponse::SetError((cmServerResponse *)local_358,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
      WriteResponse(this,connection,(cmServerResponse *)local_358,(DebugInfo *)0x0);
      debug._M_t.
      super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>._M_t.
      super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>.
      super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl._0_4_ = 1;
      cmServerResponse::~cmServerResponse((cmServerResponse *)local_358);
    }
    cmServerRequest::~cmServerRequest((cmServerRequest *)local_260);
    Json::Value::~Value((Value *)local_1c0);
    std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::~unique_ptr
              ((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
               &debugValue.limit_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"Failed to parse JSON input.",
               (allocator<char> *)
               ((long)&debug._M_t.
                       super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                       .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl + 7));
    WriteParseError(this,connection,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&debug._M_t.
                       super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                       .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl + 7));
    debug._M_t.super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
    ._M_t.super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>.
    super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl._0_4_ = 1;
  }
  Json::Value::~Value((Value *)local_158);
  Json::Reader::~Reader((Reader *)&value.limit_);
  return;
}

Assistant:

void cmServer::ProcessRequest(cmConnection* connection,
                              const std::string& input)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(input, value)) {
    this->WriteParseError(connection, "Failed to parse JSON input.");
    return;
  }

  std::unique_ptr<DebugInfo> debug;
  Json::Value debugValue = value["debug"];
  if (!debugValue.isNull()) {
    debug = cm::make_unique<DebugInfo>();
    debug->OutputFile = debugValue["dumpToFile"].asString();
    debug->PrintStatistics = debugValue["showStats"].asBool();
  }

  const cmServerRequest request(this, connection, value[kTYPE_KEY].asString(),
                                value[kCOOKIE_KEY].asString(), value);

  if (request.Type.empty()) {
    cmServerResponse response(request);
    response.SetError("No type given in request.");
    this->WriteResponse(connection, response, nullptr);
    return;
  }

  cmSystemTools::SetMessageCallback(
    [&request](const std::string& msg, const char* title) {
      reportMessage(msg, title, request);
    });

  if (this->Protocol) {
    this->Protocol->CMakeInstance()->SetProgressCallback(
      [&request](const std::string& msg, float prog) {
        reportProgress(msg, prog, request);
      });
    this->WriteResponse(connection, this->Protocol->Process(request),
                        debug.get());
  } else {
    this->WriteResponse(connection, this->SetProtocolVersion(request),
                        debug.get());
  }
}